

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3.cpp
# Opt level: O0

void vecNormalize(vec_t *vin,vec_t *vout)

{
  vec_t vVar1;
  double dVar2;
  vec_t length;
  vec_t *vout_local;
  vec_t *vin_local;
  
  vVar1 = vecLength(vin);
  if ((vVar1 != 0.0) || (NAN(vVar1))) {
    dVar2 = 1.0 / vVar1;
    *vout = *vin * dVar2;
    vout[1] = vin[1] * dVar2;
    vout[2] = vin[2] * dVar2;
  }
  else {
    vecClear(vout);
  }
  return;
}

Assistant:

void vecNormalize( const vec3_t vin, vec3_t vout ){
	vec_t length;

	length = vecLength( vin );

	if( length )
	{
		length = 1/length;

		vout[X]=vin[X]*length;
		vout[Y]=vin[Y]*length;
		vout[Z]=vin[Z]*length;
	} else 
		vecClear( vout );
}